

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateDestructorCode
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  undefined1 local_a0 [8];
  Formatter format;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = IsFieldStripped((this->super_FieldGenerator).descriptor_,
                          (this->super_FieldGenerator).options_);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message_field.cc"
               ,0x1ac);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !IsFieldStripped(descriptor_, options_): ");
    internal::LogFinisher::operator=
              ((LogFinisher *)
               ((long)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  Formatter::Formatter((Formatter *)local_a0,local_18,&(this->super_FieldGenerator).variables_);
  if ((((this->super_FieldGenerator).options_)->opensource_runtime & 1U) != 0) {
    Formatter::operator()<>((Formatter *)local_a0,"if (this != internal_default_instance()) ");
  }
  Formatter::operator()<>((Formatter *)local_a0,"delete $name$_;\n");
  Formatter::~Formatter((Formatter *)local_a0);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateDestructorCode(io::Printer* printer) const {
  GOOGLE_CHECK(!IsFieldStripped(descriptor_, options_));

  Formatter format(printer, variables_);
  if (options_.opensource_runtime) {
    // TODO(gerbens) Remove this when we don't need to destruct default
    // instances.  In google3 a default instance will never get deleted so we
    // don't need to worry about that but in opensource protobuf default
    // instances are deleted in shutdown process and we need to take special
    // care when handling them.
    format("if (this != internal_default_instance()) ");
  }
  format("delete $name$_;\n");
}